

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall Fl_Text_Display::move_down(Fl_Text_Display *this)

{
  int iVar1;
  int rightClip;
  int iVar2;
  int iVar3;
  int in_R8D;
  int in_R9D;
  int visLineNum;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int local_24;
  
  iVar1 = 0;
  if (this->mCursorPos != this->mBuffer->mLength) {
    iVar1 = position_to_line(this,this->mCursorPos,&local_24);
    if (iVar1 == 0) {
      iVar2 = line_start(this,this->mCursorPos);
      local_24 = -1;
    }
    else {
      iVar2 = this->mLineStarts[local_24];
    }
    rightClip = this->mCursorPreferredXPos;
    if (rightClip < 0) {
      rightClip = handle_vline(this,3,iVar2,this->mCursorPos - iVar2,in_R8D,in_R9D,0,
                               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,0x7fffffff);
    }
    iVar1 = 1;
    iVar2 = skip_lines(this,iVar2,1,true);
    iVar3 = line_end(this,iVar2,true);
    iVar2 = handle_vline(this,2,iVar2,iVar3 - iVar2,in_R8D,in_R9D,0,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffc8,rightClip);
    insert_position(this,iVar2);
    this->mCursorPreferredXPos = rightClip;
  }
  return iVar1;
}

Assistant:

int Fl_Text_Display::move_down() {
  int lineStartPos, xPos, newPos, visLineNum;

  if ( mCursorPos == mBuffer->length() )
    return 0;

  if ( position_to_line( mCursorPos, &visLineNum ) )
    lineStartPos = mLineStarts[ visLineNum ];
  else {
    lineStartPos = line_start( mCursorPos );
    visLineNum = -1;
  }
  if (mCursorPreferredXPos >= 0) {
    xPos = mCursorPreferredXPos;
  } else {
    xPos = handle_vline(GET_WIDTH, lineStartPos, mCursorPos-lineStartPos,
                        0, 0, 0, 0, 0, INT_MAX);
  }

  int nextLineStartPos = skip_lines( lineStartPos, 1, true );
  int lineEnd = line_end(nextLineStartPos, true);
  newPos = handle_vline(FIND_INDEX_FROM_ZERO, nextLineStartPos, lineEnd-nextLineStartPos,
                        0, 0, 0, 0, 0, xPos);

  insert_position( newPos );
  mCursorPreferredXPos = xPos;
  return 1;
}